

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

const_iterator * __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
::cend(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
       *this)

{
  value_t vVar1;
  const_iterator *result;
  
  result->m_object = this;
  (result->m_it).object_iterator._M_node = (_Base_ptr)0x0;
  (result->m_it).array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        *)0x0;
  (result->m_it).primitive_iterator.m_it = -0x8000000000000000;
  vVar1 = this->m_type;
  if (vVar1 == array) {
    (result->m_it).array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)0x0;
  }
  else if (vVar1 == object) {
    (result->m_it).object_iterator._M_node = (_Base_ptr)0x0;
  }
  else {
    (result->m_it).primitive_iterator.m_it = -0x8000000000000000;
  }
  if (vVar1 != array) {
    if (vVar1 == object) {
      (result->m_it).object_iterator._M_node =
           &(((this->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
      return result;
    }
    (result->m_it).primitive_iterator.m_it = 1;
    return result;
  }
  (result->m_it).array_iterator._M_current =
       (((this->m_value).array)->
       super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  return result;
}

Assistant:

const_iterator cend() const noexcept
    {
        const_iterator result(this);
        result.set_end();
        return result;
    }